

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O2

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::EnumBoundCastData::Copy(EnumBoundCastData *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  _func_int **local_48;
  BoundCastInfo local_40;
  BoundCastInfo local_28;
  
  BoundCastInfo::Copy(&local_28,(BoundCastInfo *)(in_RSI + 8));
  BoundCastInfo::Copy(&local_40,(BoundCastInfo *)(in_RSI + 0x20));
  make_uniq<duckdb::EnumBoundCastData,duckdb::BoundCastInfo,duckdb::BoundCastInfo>
            ((duckdb *)&local_48,&local_28,&local_40);
  pp_Var1 = local_48;
  local_48 = (_func_int **)0x0;
  (this->super_BoundCastData)._vptr_BoundCastData = pp_Var1;
  if (local_40.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.cast_data.
                          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl + 8))
              ();
  }
  if ((_Head_base<0UL,_duckdb::BoundCastData_*,_false>)
      local_28.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
      (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_28.cast_data.
        super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
        .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl)[1])();
  }
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)this;
}

Assistant:

unique_ptr<BoundCastData> Copy() const override {
		return make_uniq<EnumBoundCastData>(to_varchar_cast.Copy(), from_varchar_cast.Copy());
	}